

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O3

ParseStatus ParseVP8XChunks(WebPDemuxer *dmux)

{
  byte bVar1;
  uint8_t uVar2;
  ushort uVar3;
  undefined2 uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint32_t uVar8;
  uint8_t *puVar9;
  Frame *pFVar10;
  bool bVar11;
  uint uVar12;
  Chunk *pCVar13;
  size_t sVar14;
  Frame *frame;
  int iVar15;
  uint uVar16;
  ParseStatus PVar17;
  ParseStatus PVar18;
  size_t sVar19;
  uint uVar20;
  ulong uVar21;
  
  uVar5 = dmux->feature_flags_;
  sVar19 = (dmux->mem_).start_;
  bVar11 = false;
  do {
    puVar9 = (dmux->mem_).buf_;
    iVar6 = *(int *)(puVar9 + sVar19);
    (dmux->mem_).start_ = sVar19 + 4;
    uVar7 = *(uint *)(puVar9 + sVar19 + 4);
    sVar14 = sVar19 + 8;
    (dmux->mem_).start_ = sVar14;
    if (0xfffffff6 < (ulong)uVar7) {
      return PARSE_ERROR;
    }
    uVar20 = (uVar7 & 1) + uVar7;
    uVar21 = (ulong)uVar20;
    if ((dmux->mem_).riff_end_ - sVar14 < uVar21) {
      return PARSE_ERROR;
    }
    if (iVar6 < 0x48504c41) {
      if (iVar6 < 0x46495845) {
        if (iVar6 == 0x20385056) {
LAB_00105934:
          if (bVar11) {
            return PARSE_ERROR;
          }
          if ((uVar5 & 2) != 0) {
            return PARSE_ERROR;
          }
          (dmux->mem_).start_ = sVar19;
          PVar17 = ParseSingleImage(dmux);
          bVar11 = false;
          goto LAB_00105a72;
        }
        if (iVar6 != 0x20504d58) goto LAB_00105a0e;
        iVar15 = 2;
      }
      else {
        if (iVar6 != 0x46495845) {
          if (iVar6 != 0x464d4e41) goto LAB_00105a0e;
          if (!bVar11) {
            return PARSE_ERROR;
          }
          bVar11 = true;
          PVar17 = PARSE_ERROR;
          if (0xf < uVar20) {
            if ((dmux->mem_).end_ - sVar14 < 0x10) {
              PVar17 = PARSE_NEED_MORE_DATA;
            }
            else {
              uVar7 = dmux->feature_flags_;
              frame = (Frame *)WebPSafeCalloc(1,0x50);
              if (frame != (Frame *)0x0) {
                sVar19 = (dmux->mem_).start_;
                puVar9 = (dmux->mem_).buf_;
                uVar3 = *(ushort *)(puVar9 + sVar19);
                bVar1 = puVar9[sVar19 + 2];
                (dmux->mem_).start_ = sVar19 + 3;
                frame->x_offset_ = (uint)bVar1 * 0x20000 + (uint)uVar3 * 2;
                uVar3 = *(ushort *)(puVar9 + sVar19 + 3);
                bVar1 = puVar9[sVar19 + 5];
                (dmux->mem_).start_ = sVar19 + 6;
                frame->y_offset_ = (uint)bVar1 * 0x20000 + (uint)uVar3 * 2;
                uVar3 = *(ushort *)(puVar9 + sVar19 + 6);
                bVar1 = puVar9[sVar19 + 8];
                (dmux->mem_).start_ = sVar19 + 9;
                uVar12 = (uint)uVar3 + (uint)bVar1 * 0x10000 + 1;
                frame->width_ = uVar12;
                uVar3 = *(ushort *)(puVar9 + sVar19 + 9);
                bVar1 = puVar9[sVar19 + 0xb];
                (dmux->mem_).start_ = sVar19 + 0xc;
                uVar16 = (uint)uVar3 + (uint)bVar1 * 0x10000 + 1;
                frame->height_ = uVar16;
                uVar4 = *(undefined2 *)(puVar9 + sVar19 + 0xc);
                uVar2 = puVar9[sVar19 + 0xe];
                (dmux->mem_).start_ = sVar19 + 0xf;
                frame->duration_ = (uint)CONCAT12(uVar2,uVar4);
                bVar1 = puVar9[sVar19 + 0xf];
                (dmux->mem_).start_ = sVar19 + 0x10;
                frame->dispose_method_ = bVar1 & WEBP_MUX_DISPOSE_BACKGROUND;
                frame->blend_method_ = bVar1 >> 1 & WEBP_MUX_NO_BLEND;
                if ((int)((ulong)uVar12 * (ulong)uVar16 >> 0x20) == 0) {
                  PVar17 = StoreFrame(dmux->num_frames_ + 1,uVar20 - 0x10,&dmux->mem_,frame);
                  PVar18 = PARSE_ERROR;
                  if (PVar17 != PARSE_ERROR) {
                    PVar18 = PVar17;
                    if ((ulong)(uVar20 - 0x10) < (dmux->mem_).start_ - (sVar19 + 0x10)) {
                      PVar18 = PARSE_ERROR;
                    }
                    if (((PVar18 != PARSE_ERROR) && ((uVar7 & 2) != 0)) &&
                       (PVar18 = PVar17, 0 < frame->frame_num_)) {
                      pFVar10 = *dmux->frames_tail_;
                      if ((pFVar10 == (Frame *)0x0) ||
                         (PVar18 = PARSE_ERROR, pFVar10->complete_ != 0)) {
                        *dmux->frames_tail_ = frame;
                        frame->next_ = (Frame *)0x0;
                        dmux->frames_tail_ = &frame->next_;
                        dmux->num_frames_ = dmux->num_frames_ + 1;
                        goto LAB_00105a72;
                      }
                    }
                  }
                  PVar17 = PVar18;
                  WebPSafeFree(frame);
                }
                else {
                  WebPSafeFree(frame);
                }
              }
            }
          }
          goto LAB_00105a72;
        }
        iVar15 = 3;
      }
LAB_001059ba:
      PVar17 = PARSE_NEED_MORE_DATA;
      if ((dmux->mem_).end_ - sVar14 < uVar21) goto LAB_00105a72;
      if ((dmux->feature_flags_ >> iVar15 & 1) != 0) {
LAB_00105a1f:
        pCVar13 = (Chunk *)WebPSafeCalloc(1,0x18);
        if (pCVar13 == (Chunk *)0x0) {
          return PARSE_ERROR;
        }
        (pCVar13->data_).offset_ = sVar19;
        (pCVar13->data_).size_ = (ulong)uVar7 + 8;
        *dmux->chunks_tail_ = pCVar13;
        pCVar13->next_ = (Chunk *)0x0;
        dmux->chunks_tail_ = &pCVar13->next_;
        sVar14 = (dmux->mem_).start_;
      }
LAB_00105a6a:
      (dmux->mem_).start_ = sVar14 + uVar21;
LAB_00105a70:
      PVar17 = PARSE_OK;
    }
    else if (iVar6 < 0x4d494e41) {
      if ((iVar6 == 0x48504c41) || (iVar6 == 0x4c385056)) goto LAB_00105934;
LAB_00105a0e:
      PVar17 = PARSE_NEED_MORE_DATA;
      if (uVar21 <= (dmux->mem_).end_ - sVar14) goto LAB_00105a1f;
    }
    else {
      if (iVar6 != 0x4d494e41) {
        iVar15 = 5;
        if (iVar6 == 0x50434349) goto LAB_001059ba;
        if (iVar6 == 0x58385056) {
          return PARSE_ERROR;
        }
        goto LAB_00105a0e;
      }
      if (uVar20 < 6) {
        return PARSE_ERROR;
      }
      PVar17 = PARSE_NEED_MORE_DATA;
      if (uVar21 <= (dmux->mem_).end_ - sVar14) {
        if (bVar11) {
          if (uVar21 <= (dmux->mem_).end_ - sVar14) goto LAB_00105a6a;
          goto LAB_00105a72;
        }
        uVar8 = *(uint32_t *)(puVar9 + sVar19 + 8);
        (dmux->mem_).start_ = sVar19 + 0xc;
        dmux->bgcolor_ = uVar8;
        dmux->loop_count_ = (uint)*(ushort *)(puVar9 + sVar19 + 0xc);
        (dmux->mem_).start_ = (uVar20 - 6) + sVar19 + 0xe;
        bVar11 = true;
        goto LAB_00105a70;
      }
    }
LAB_00105a72:
    sVar19 = (dmux->mem_).start_;
    if (sVar19 == (dmux->mem_).riff_end_) {
      return PVar17;
    }
    if ((dmux->mem_).end_ - sVar19 < 8) {
      PVar17 = PARSE_NEED_MORE_DATA;
    }
    if (PVar17 != PARSE_OK) {
      return PVar17;
    }
  } while( true );
}

Assistant:

static ParseStatus ParseVP8XChunks(WebPDemuxer* const dmux) {
  const int is_animation = !!(dmux->feature_flags_ & ANIMATION_FLAG);
  MemBuffer* const mem = &dmux->mem_;
  int anim_chunks = 0;
  ParseStatus status = PARSE_OK;

  do {
    int store_chunk = 1;
    const size_t chunk_start_offset = mem->start_;
    const uint32_t fourcc = ReadLE32(mem);
    const uint32_t chunk_size = ReadLE32(mem);
    uint32_t chunk_size_padded;

    if (chunk_size > MAX_CHUNK_PAYLOAD) return PARSE_ERROR;

    chunk_size_padded = chunk_size + (chunk_size & 1);
    if (SizeIsInvalid(mem, chunk_size_padded)) return PARSE_ERROR;

    switch (fourcc) {
      case MKFOURCC('V', 'P', '8', 'X'): {
        return PARSE_ERROR;
      }
      case MKFOURCC('A', 'L', 'P', 'H'):
      case MKFOURCC('V', 'P', '8', ' '):
      case MKFOURCC('V', 'P', '8', 'L'): {
        // check that this isn't an animation (all frames should be in an ANMF).
        if (anim_chunks > 0 || is_animation) return PARSE_ERROR;

        Rewind(mem, CHUNK_HEADER_SIZE);
        status = ParseSingleImage(dmux);
        break;
      }
      case MKFOURCC('A', 'N', 'I', 'M'): {
        if (chunk_size_padded < ANIM_CHUNK_SIZE) return PARSE_ERROR;

        if (MemDataSize(mem) < chunk_size_padded) {
          status = PARSE_NEED_MORE_DATA;
        } else if (anim_chunks == 0) {
          ++anim_chunks;
          dmux->bgcolor_ = ReadLE32(mem);
          dmux->loop_count_ = ReadLE16s(mem);
          Skip(mem, chunk_size_padded - ANIM_CHUNK_SIZE);
        } else {
          store_chunk = 0;
          goto Skip;
        }
        break;
      }
      case MKFOURCC('A', 'N', 'M', 'F'): {
        if (anim_chunks == 0) return PARSE_ERROR;  // 'ANIM' precedes frames.
        status = ParseAnimationFrame(dmux, chunk_size_padded);
        break;
      }
      case MKFOURCC('I', 'C', 'C', 'P'): {
        store_chunk = !!(dmux->feature_flags_ & ICCP_FLAG);
        goto Skip;
      }
      case MKFOURCC('E', 'X', 'I', 'F'): {
        store_chunk = !!(dmux->feature_flags_ & EXIF_FLAG);
        goto Skip;
      }
      case MKFOURCC('X', 'M', 'P', ' '): {
        store_chunk = !!(dmux->feature_flags_ & XMP_FLAG);
        goto Skip;
      }
 Skip:
      default: {
        if (chunk_size_padded <= MemDataSize(mem)) {
          if (store_chunk) {
            // Store only the chunk header and unpadded size as only the payload
            // will be returned to the user.
            if (!StoreChunk(dmux, chunk_start_offset,
                            CHUNK_HEADER_SIZE + chunk_size)) {
              return PARSE_ERROR;
            }
          }
          Skip(mem, chunk_size_padded);
        } else {
          status = PARSE_NEED_MORE_DATA;
        }
      }
    }

    if (mem->start_ == mem->riff_end_) {
      break;
    } else if (MemDataSize(mem) < CHUNK_HEADER_SIZE) {
      status = PARSE_NEED_MORE_DATA;
    }
  } while (status == PARSE_OK);

  return status;
}